

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

String testing::internal::GetCurrentOsStackTraceExceptTop(UnitTest *param_1,int skip_count)

{
  undefined4 in_EDX;
  char *in_RDI;
  String SVar1;
  undefined4 in_stack_ffffffffffffffe8;
  
  GetUnitTestImpl();
  SVar1 = UnitTestImpl::CurrentOsStackTraceExceptTop
                    ((UnitTestImpl *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                     (int)((ulong)in_RDI >> 0x20));
  SVar1.c_str_ = in_RDI;
  return SVar1;
}

Assistant:

String GetCurrentOsStackTraceExceptTop(UnitTest* /*unit_test*/,
                                       int skip_count) {
  // We pass skip_count + 1 to skip this wrapper function in addition
  // to what the user really wants to skip.
  return GetUnitTestImpl()->CurrentOsStackTraceExceptTop(skip_count + 1);
}